

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-server.c
# Opt level: O3

int lws_ssl_server_name_cb(SSL *ssl,int *ad,void *arg)

{
  long lVar1;
  SSL_CTX *pSVar2;
  SSL_CTX *pSVar3;
  char *servername;
  lws_vhost *plVar4;
  int iVar5;
  
  if (ssl == (SSL *)0x0) {
    iVar5 = 3;
  }
  else {
    lVar1 = *(long *)((long)arg + 0x420);
    while( true ) {
      if (lVar1 == 0) {
        __assert_fail("vh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/tls/openssl/openssl-server.c"
                      ,0x78,"int lws_ssl_server_name_cb(SSL *, int *, void *)");
      }
      if (((*(byte *)(lVar1 + 0x2b4) & 4) == 0) &&
         (pSVar2 = *(SSL_CTX **)(lVar1 + 0x218), pSVar3 = SSL_get_SSL_CTX((SSL *)ssl),
         pSVar2 == pSVar3)) break;
      lVar1 = *(long *)(lVar1 + 0x150);
    }
    iVar5 = 0;
    servername = SSL_get_servername((SSL *)ssl,0);
    if (servername == (char *)0x0) {
      _lws_log(8,"SNI: Unknown ServerName\n");
    }
    else {
      plVar4 = lws_select_vhost((lws_context *)arg,*(int *)(lVar1 + 0x290),servername);
      if (plVar4 == (lws_vhost *)0x0) {
        iVar5 = 0;
        _lws_log(8,"SNI: none: %s:%d\n",servername,(ulong)*(uint *)(lVar1 + 0x290));
      }
      else {
        iVar5 = 0;
        _lws_log(8,"SNI: Found: %s:%d\n",servername,(ulong)*(uint *)(lVar1 + 0x290));
        SSL_set_SSL_CTX((SSL *)ssl,(SSL_CTX *)(plVar4->tls).ssl_ctx);
      }
    }
  }
  return iVar5;
}

Assistant:

static int
lws_ssl_server_name_cb(SSL *ssl, int *ad, void *arg)
{
	struct lws_context *context = (struct lws_context *)arg;
	struct lws_vhost *vhost, *vh;
	const char *servername;

	if (!ssl)
		return SSL_TLSEXT_ERR_NOACK;

	/*
	 * We can only get ssl accepted connections by using a vhost's ssl_ctx
	 * find out which listening one took us and only match vhosts on the
	 * same port.
	 */
	vh = context->vhost_list;
	while (vh) {
		if (!vh->being_destroyed &&
		    vh->tls.ssl_ctx == SSL_get_SSL_CTX(ssl))
			break;
		vh = vh->vhost_next;
	}

	if (!vh) {
		assert(vh); /* can't match the incoming vh? */
		return SSL_TLSEXT_ERR_OK;
	}

	servername = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);
	if (!servername) {
		/* the client doesn't know what hostname it wants */
		lwsl_info("SNI: Unknown ServerName\n");

		return SSL_TLSEXT_ERR_OK;
	}

	vhost = lws_select_vhost(context, vh->listen_port, servername);
	if (!vhost) {
		lwsl_info("SNI: none: %s:%d\n", servername, vh->listen_port);

		return SSL_TLSEXT_ERR_OK;
	}

	lwsl_info("SNI: Found: %s:%d\n", servername, vh->listen_port);

	/* select the ssl ctx from the selected vhost for this conn */
	SSL_set_SSL_CTX(ssl, vhost->tls.ssl_ctx);

	return SSL_TLSEXT_ERR_OK;
}